

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

double get_removal_time(int mode,int num_decoded_frame,int decoder_buffer_delay,
                       FRAME_BUFFER *frame_buffer_pool,double current_time)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  
  if (mode == 1) {
    return -1.0;
  }
  if (num_decoded_frame == 0) {
    return (double)decoder_buffer_delay / 90000.0;
  }
  uVar2 = 0;
  bVar3 = false;
  dVar4 = 1e+16;
  do {
    bVar1 = true;
    dVar5 = dVar4;
    if (frame_buffer_pool->decoder_ref_count == 0) {
      if (frame_buffer_pool->player_ref_count == 0) {
        bVar1 = false;
      }
      else {
        dVar5 = frame_buffer_pool->presentation_time;
        if (dVar5 < 0.0 || dVar4 <= dVar5) {
          dVar5 = dVar4;
        }
      }
    }
    if (!bVar1) break;
    bVar3 = 8 < uVar2;
    uVar2 = uVar2 + 1;
    frame_buffer_pool = frame_buffer_pool + 1;
    dVar4 = dVar5;
  } while (uVar2 != 10);
  if (bVar3) {
    current_time = (double)(~-(ulong)(dVar5 < 1e+16) & 0xbff0000000000000 |
                           (ulong)dVar5 & -(ulong)(dVar5 < 1e+16));
  }
  return current_time;
}

Assistant:

static double get_removal_time(int mode, int num_decoded_frame,
                               int decoder_buffer_delay,
                               const FRAME_BUFFER *frame_buffer_pool,
                               double current_time) {
  if (mode == SCHEDULE_MODE) {
    assert(0 && "SCHEDULE_MODE IS NOT SUPPORTED YET");
    return INVALID_TIME;
  } else {
    return time_next_buffer_is_free(num_decoded_frame, decoder_buffer_delay,
                                    frame_buffer_pool, current_time);
  }
}